

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

char * ImGui::SaveIniSettingsToMemory(size_t *out_size)

{
  ImGuiTextBuffer *pIVar1;
  int *piVar2;
  int iVar3;
  ImGuiSettingsHandler *pIVar4;
  ImGuiContext *pIVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  ImGuiContext *ctx;
  long lVar9;
  long lVar10;
  
  pIVar5 = GImGui;
  GImGui->SettingsDirtyTimer = 0.0;
  pIVar1 = &pIVar5->SettingsIniData;
  iVar3 = (pIVar5->SettingsIniData).Buf.Capacity;
  if (iVar3 < 0) {
    piVar2 = &(pIVar5->IO).MetricsActiveAllocations;
    *piVar2 = *piVar2 + 1;
    pcVar7 = (char *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pcVar8 = (pIVar5->SettingsIniData).Buf.Data;
    if (pcVar8 != (char *)0x0) {
      memcpy(pcVar7,pcVar8,(long)(pIVar5->SettingsIniData).Buf.Size);
      pcVar8 = (pIVar5->SettingsIniData).Buf.Data;
      if ((pcVar8 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar2 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar2 = *piVar2 + -1;
      }
      (*GImAllocatorFreeFunc)(pcVar8,GImAllocatorUserData);
    }
    (pIVar5->SettingsIniData).Buf.Data = pcVar7;
    (pIVar5->SettingsIniData).Buf.Size = 0;
    (pIVar5->SettingsIniData).Buf.Capacity = 0;
  }
  else {
    (pIVar1->Buf).Size = 0;
    if (iVar3 != 0) {
      pcVar8 = (pIVar5->SettingsIniData).Buf.Data;
      lVar9 = 0;
      goto LAB_0011f3a3;
    }
  }
  if (GImGui != (ImGuiContext *)0x0) {
    piVar2 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar2 = *piVar2 + 1;
  }
  pcVar8 = (char *)(*GImAllocatorAllocFunc)(8,GImAllocatorUserData);
  pcVar7 = (pIVar5->SettingsIniData).Buf.Data;
  if (pcVar7 != (char *)0x0) {
    memcpy(pcVar8,pcVar7,(long)(pIVar5->SettingsIniData).Buf.Size);
    pcVar7 = (pIVar5->SettingsIniData).Buf.Data;
    if ((pcVar7 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
      piVar2 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar2 = *piVar2 + -1;
    }
    (*GImAllocatorFreeFunc)(pcVar7,GImAllocatorUserData);
  }
  (pIVar5->SettingsIniData).Buf.Data = pcVar8;
  (pIVar5->SettingsIniData).Buf.Capacity = 8;
  lVar9 = (long)(pIVar5->SettingsIniData).Buf.Size;
LAB_0011f3a3:
  pcVar8[lVar9] = '\0';
  (pIVar5->SettingsIniData).Buf.Size = (pIVar5->SettingsIniData).Buf.Size + 1;
  if (0 < (pIVar5->SettingsHandlers).Size) {
    lVar9 = 0;
    lVar10 = 0;
    do {
      pIVar4 = (pIVar5->SettingsHandlers).Data;
      (**(code **)((long)&pIVar4->WriteAllFn + lVar9))
                (pIVar5,(long)&pIVar4->TypeName + lVar9,pIVar1);
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 0x30;
    } while (lVar10 < (pIVar5->SettingsHandlers).Size);
  }
  if (out_size != (size_t *)0x0) {
    iVar3 = (pIVar1->Buf).Size;
    iVar6 = iVar3 + -1;
    if (iVar3 == 0) {
      iVar6 = 0;
    }
    *out_size = (long)iVar6;
  }
  pcVar8 = (pIVar5->SettingsIniData).Buf.Data;
  pcVar7 = ImGuiTextBuffer::EmptyString;
  if (pcVar8 != (char *)0x0) {
    pcVar7 = pcVar8;
  }
  return pcVar7;
}

Assistant:

const char* ImGui::SaveIniSettingsToMemory(size_t* out_size)
{
    ImGuiContext& g = *GImGui;
    g.SettingsDirtyTimer = 0.0f;
    g.SettingsIniData.Buf.resize(0);
    g.SettingsIniData.Buf.push_back(0);
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
    {
        ImGuiSettingsHandler* handler = &g.SettingsHandlers[handler_n];
        handler->WriteAllFn(&g, handler, &g.SettingsIniData);
    }
    if (out_size)
        *out_size = (size_t)g.SettingsIniData.size();
    return g.SettingsIniData.c_str();
}